

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O3

void test_json_class_exceptions(void)

{
  pointer pcVar1;
  undefined1 *puVar2;
  bool bVar3;
  string *psVar4;
  json j_14;
  json j;
  json r2;
  undefined1 *local_188 [2];
  undefined1 local_178 [72];
  json local_130;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [72];
  string local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  argo::json::json(&local_130,100);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: construct invalid type failed to throw exception\n",0x37);
  argo::json::~json(&local_130);
  puVar2 = (undefined1 *)((long)&((json *)local_188)->m_value + 8);
  local_188[0] = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"asdadasd","");
  argo::json::json(&local_130,array_e,(string *)local_188);
  if (local_188[0] != puVar2) {
    operator_delete(local_188[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,
             "FAIL: construct invalid type with raw value failed to throw exception\n",0x46);
  argo::json::~json(&local_130);
  local_188[0] = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"100","");
  argo::json::json(&local_130,number_int_e,(string *)local_188);
  if (local_188[0] != puVar2) {
    operator_delete(local_188[0]);
  }
  argo::json::operator_cast_to_int(&local_130);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: cast raw to int failed to throw exception\n",0x30);
  argo::json::~json(&local_130);
  argo::json::json(&local_130,"100");
  argo::json::operator_cast_to_int(&local_130);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: cast string to int failed to throw exception\n",0x33);
  argo::json::~json(&local_130);
  local_188[0] = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"100","");
  argo::json::json(&local_130,number_double_e,(string *)local_188);
  if (local_188[0] != puVar2) {
    operator_delete(local_188[0]);
  }
  argo::json::operator_cast_to_double(&local_130);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: cast raw double to double failed to throw exception\n",0x3a);
  argo::json::~json(&local_130);
  argo::json::json(&local_130,"100");
  argo::json::operator_cast_to_double(&local_130);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: cast string to double failed to throw exception\n",0x36);
  argo::json::~json(&local_130);
  local_188[0] = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"100","");
  argo::json::json(&local_130,string_e,(string *)local_188);
  if (local_188[0] != puVar2) {
    operator_delete(local_188[0]);
  }
  psVar4 = argo::json::operator_cast_to_string_(&local_130);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + psVar4->_M_string_length);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: cast raw string to string failed to throw exception\n",0x3a);
  argo::json::~json(&local_130);
  argo::json::json(&local_130,100);
  psVar4 = argo::json::operator_cast_to_string_(&local_130);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + psVar4->_M_string_length);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: cast int to string failed to throw exception\n",0x33);
  argo::json::~json(&local_130);
  argo::json::json(&local_130,"asdasd");
  argo::json::operator_cast_to_bool(&local_130);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: cast string to bool failed to throw exception\n",0x34);
  argo::json::~json(&local_130);
  argo::json::json(&local_130,"asdasd");
  argo::json::operator[](&local_130,"asdasd");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,
             "FAIL: attempt to access string via [\"name\"] failed to throw exception\n",0x46);
  argo::json::~json(&local_130);
  argo::json::json(&local_130,"asdasd");
  argo::json::operator[](&local_130,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: attempt to access string via [1] failed to throw exception\n",
             0x41);
  argo::json::~json(&local_130);
  argo::json::json(&local_130,array_e);
  argo::json::operator[](&local_130,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,
             "FAIL: attempt to access item 1 of zero length array failed to throw exception\n",0x4e)
  ;
  argo::json::~json(&local_130);
  argo::json::json(&local_130,array_e);
  argo::json::operator[](&local_130,-1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,
             "FAIL: attempt to access item -1 of zero length array failed to throw exception\n",0x4f
            );
  argo::json::~json(&local_130);
  argo::json::json(&local_130,object_e);
  test_const_exception(&local_130);
  argo::json::json((json *)local_188,1);
  argo::json::json((json *)local_d8,1);
  argo::json::append((json *)local_188,(json *)local_d8);
  argo::json::~json((json *)local_d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: attempt to append to non-array failed to throw exception\n",
             0x3f);
  argo::json::~json((json *)local_188);
  argo::json::json((json *)local_188,1);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"asdasd","");
  argo::json::json((json *)local_d8,1);
  argo::json::insert((json *)local_188,&local_80,(json *)local_d8);
  argo::json::~json((json *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: attempt insert into non-object failed to throw exception\n",
             0x3f);
  argo::json::~json((json *)local_188);
  puVar2 = (undefined1 *)((long)&((json *)local_d8)->m_value + 8);
  local_d8[0] = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"123","");
  argo::json::json((json *)local_188,number_int_e,(string *)local_d8);
  if (local_d8[0] != puVar2) {
    operator_delete(local_d8[0]);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"123","");
  argo::json::json((json *)local_d8,number_int_e,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  bVar3 = argo::json::operator==((json *)local_188,(json *)local_d8);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&jlog,"PASS: attempt to compare raw ints failed to throw exception\n",0x3c
              );
  }
  argo::json::~json((json *)local_d8);
  argo::json::~json((json *)local_188);
  local_d8[0] = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"123","");
  argo::json::json((json *)local_188,number_int_e,(string *)local_d8);
  if (local_d8[0] != puVar2) {
    operator_delete(local_d8[0]);
  }
  bVar3 = argo::json::operator==((json *)local_188,0x7b);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&jlog,
               "FAIL: attempt to compare raw int to int failed to throw exception\n",0x42);
  }
  argo::json::~json((json *)local_188);
  local_d8[0] = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"123","");
  argo::json::json((json *)local_188,string_e,(string *)local_d8);
  if (local_d8[0] != puVar2) {
    operator_delete(local_d8[0]);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"123","");
  argo::json::json((json *)local_d8,string_e,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  bVar3 = argo::json::operator==((json *)local_188,(json *)local_d8);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&jlog,"FAIL: attempt to compare raw strings failed to throw exception\n",
               0x3f);
  }
  argo::json::~json((json *)local_d8);
  argo::json::~json((json *)local_188);
  local_d8[0] = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"123","");
  argo::json::json((json *)local_188,string_e,(string *)local_d8);
  if (local_d8[0] != puVar2) {
    operator_delete(local_d8[0]);
  }
  bVar3 = argo::json::operator==((json *)local_188,"123");
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&jlog,"FAIL: attempt to compare raw strings failed to throw exception\n",
               0x3f);
  }
  argo::json::~json((json *)local_188);
  argo::json::json((json *)local_188,100);
  argo::json::json((json *)local_d8,"asdasd");
  argo::json::operator<((json *)local_188,(json *)local_d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: < compare incomparable types failed to throw exception\n",0x3d)
  ;
  argo::json::~json((json *)local_d8);
  argo::json::~json((json *)local_188);
  argo::json::json((json *)local_188,100);
  argo::json::json((json *)local_d8,"asdasd");
  argo::json::operator<=((json *)local_188,(json *)local_d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: <= compare incomparable types failed to throw exception\n",0x3e
            );
  argo::json::~json((json *)local_d8);
  argo::json::~json((json *)local_188);
  argo::json::json((json *)local_188,100);
  argo::json::json((json *)local_d8,"asdasd");
  argo::json::operator>((json *)local_188,(json *)local_d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: > compare incomparable types failed to throw exception\n",0x3d)
  ;
  argo::json::~json((json *)local_d8);
  argo::json::~json((json *)local_188);
  argo::json::json((json *)local_188,100);
  argo::json::json((json *)local_d8,"asdasd");
  argo::json::operator<=((json *)local_188,(json *)local_d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: >= compare incomparable types failed to throw exception\n",0x3e
            );
  argo::json::~json((json *)local_d8);
  argo::json::~json((json *)local_188);
  argo::json::~json(&local_130);
  return;
}

Assistant:

void test_json_class_exceptions()
{
    try
    {
        json j(static_cast<json::type>(100));
        jlog << "FAIL: construct invalid type failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::invalid_json_type_e)
        {
            jlog << "FAIL: construct invalid type threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: construct invalid type threw correct exception type\n";
        }
    }

    try
    {
        json j(json::array_e, "asdadasd");
        jlog << "FAIL: construct invalid type with raw value failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_number_or_string_e)
        {
            jlog << "FAIL: construct invalid type with raw value threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: construct invalid type with raw value threw correct exception type\n";
        }
    }

    try
    {
        json j(json::number_int_e, "100");
        (void)static_cast<int>(j);
        jlog << "FAIL: cast raw to int failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: cast raw to int threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast raw to int threw correct exception type\n";
        }
    }

    try
    {
        json j("100");
        (void)static_cast<int>(j);
        jlog << "FAIL: cast string to int failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_number_e)
        {
            jlog << "FAIL: cast string to int threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast string to int threw correct exception type\n";
        }
    }

    try
    {
        json j(json::number_double_e, "100");
        (void)static_cast<double>(j);
        jlog << "FAIL: cast raw double to double failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: cast raw double to double threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast raw double to double threw correct exception type\n";
        }
    }

    try
    {
        json j("100");
        (void)static_cast<double>(j);
        jlog << "FAIL: cast string to double failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_number_e)
        {
            jlog << "FAIL: cast string to double threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast string to double threw correct exception type\n";
        }
    }

    try
    {
        json j(json::string_e, "100");
        (void)static_cast<string>(j);
        jlog << "FAIL: cast raw string to string failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: cast raw string to string threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast raw string to string threw correct exception type\n";
        }
    }

    try
    {
        json j(100);
        (void)static_cast<string>(j);
        jlog << "FAIL: cast int to string failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_string_e)
        {
            jlog << "FAIL: cast int to string threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast int to string threw correct exception type\n";
        }
    }

    try
    {
        json j("asdasd");
        (void)static_cast<bool>(j);
        jlog << "FAIL: cast string to bool failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_number_int_or_boolean_e)
        {
            jlog << "FAIL: cast string to bool threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast string to bool threw correct exception type\n";
        }
    }

    try
    {
        json j("asdasd");
        (void)j["asdasd"];
        jlog << "FAIL: attempt to access string via [\"name\"] failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_an_object_e)
        {
            jlog << "FAIL: access string via [\"name\"] threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: access string via [\"name\"] threw correct exception type\n";
        }
    }

    try
    {
        json j("asdasd");
        (void)j[1];
        jlog << "FAIL: attempt to access string via [1] failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_an_array_e)
        {
            jlog << "FAIL: access string via [1] threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: access string via [1] threw correct exception type\n";
        }
    }

    try
    {
        json j(json::array_e);
        (void)j[1];
        jlog << "FAIL: attempt to access item 1 of zero length array failed to throw exception\n";
    }
    catch (json_array_index_range_exception &e)
    {
        if (e.get_type() != json_exception::array_index_range_e)
        {
            jlog << "FAIL: access empty array via [1] threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: access empty array via [1] threw correct exception type\n";
        }
    }

    try
    {
        json j(json::array_e);
        (void)j[-1];
        jlog << "FAIL: attempt to access item -1 of zero length array failed to throw exception\n";
    }
    catch (json_array_index_range_exception &e)
    {
        if (e.get_type() != json_exception::array_index_range_e)
        {
            jlog << "FAIL: access empty array via [-1] threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: access empty array via [-1] threw correct exception type\n";
        }
    }

    json j(json::object_e);
    test_const_exception(j);

    try
    {
        json j(1);
        j.append(json(1));
        jlog << "FAIL: attempt to append to non-array failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_an_array_e)
        {
            jlog << "FAIL: append to non-array threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: append to non-array threw correct exception type\n";
        }
    }

    try
    {
        json j(1);
        j.insert("asdasd", json(1));
        jlog << "FAIL: attempt insert into non-object failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_an_object_e)
        {
            jlog << "FAIL: insert into non-object threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: insert into non-object threw correct exception type\n";
        }
    }

    try
    {
        json r1(json::number_int_e, "123");
        json r2(json::number_int_e, "123");
        if (r1 == r2)
        {
            jlog << "PASS: attempt to compare raw ints failed to throw exception\n";
        }
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_compare_raw_e)
        {
            jlog << "FAIL: compare raw ints threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: compare raw ints threw correct exception type\n";
        }
    }

    try
    {
        json r1(json::number_int_e, "123");
        if (r1 == 123)
        {
            jlog << "FAIL: attempt to compare raw int to int failed to throw exception\n";
        }
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: compare raw int with int threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: compare raw int with int threw correct exception type\n";
        }
    }

    try
    {
        json r1(json::string_e, "123");
        json r2(json::string_e, "123");
        if (r1 == r2)
        {
            jlog << "FAIL: attempt to compare raw strings failed to throw exception\n";
        }
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_compare_raw_e)
        {
            jlog << "FAIL: compare raw strings threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: compare raw strings threw correct exception type\n";
        }
    }

    try
    {
        json r1(json::string_e, "123");
        if (r1 == "123")
        {
            jlog << "FAIL: attempt to compare raw strings failed to throw exception\n";
        }
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: compare raw strings threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: compare raw strings threw correct exception type\n";
        }
    }

    try
    {
        json j1(100);
        json j2("asdasd");
        if (j1 < j2) {};
        jlog << "FAIL: < compare incomparable types failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::types_not_comparable_e)
        {
            jlog << "FAIL: < compare incomparable types threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: < compare incomparable types threw correct exception type\n";
        }
    }

    try
    {
        json j1(100);
        json j2("asdasd");
        if (j1 <= j2) {};
        jlog << "FAIL: <= compare incomparable types failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::types_not_comparable_e)
        {
            jlog << "FAIL: <= compare incomparable types threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: <= compare incomparable types threw correct exception type\n";
        }
    }

    try
    {
        json j1(100);
        json j2("asdasd");
        if (j1 > j2) {};
        jlog << "FAIL: > compare incomparable types failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::types_not_comparable_e)
        {
            jlog << "FAIL: > compare incomparable types threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: > compare incomparable types threw correct exception type\n";
        }
    }

    try
    {
        json j1(100);
        json j2("asdasd");
        if (j1 <= j2) {};
        jlog << "FAIL: >= compare incomparable types failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::types_not_comparable_e)
        {
            jlog << "FAIL: >= compare incomparable types threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: >= compare incomparable types threw correct exception type\n";
        }
    }
}